

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::
PropagateNumericStats<duckdb::TryDecimalAdd,duckdb::AddPropagateStatistics,duckdb::AddOperator>
          (ClientContext *context,FunctionStatisticsInput *input)

{
  bool bVar1;
  PhysicalType PVar2;
  long *in_RDX;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> in_RDI;
  BaseStatistics result;
  DecimalArithmeticBindData *bind_data;
  bool potential_overflow;
  Value new_max;
  Value new_min;
  value_type *rstats;
  value_type *lstats;
  BoundFunctionExpression *expr;
  vector<duckdb::BaseStatistics,_true> *child_stats;
  Value *in_stack_fffffffffffffd68;
  BaseStatistics *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  BaseStatistics *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8c;
  undefined1 in_stack_fffffffffffffd8d;
  undefined1 in_stack_fffffffffffffd8e;
  LogicalTypeId in_stack_fffffffffffffd8f;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffd90;
  BaseStatistics *in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> in_stack_fffffffffffffe20;
  LogicalType *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe38;
  PhysicalType in_stack_fffffffffffffe3f;
  BaseStatistics local_140 [3];
  reference local_38;
  reference local_30;
  long local_28;
  long local_20;
  long *local_18;
  
  local_20 = in_RDX[2];
  local_28 = *in_RDX;
  local_18 = in_RDX;
  local_30 = vector<duckdb::BaseStatistics,_true>::operator[]
                       ((vector<duckdb::BaseStatistics,_true> *)in_stack_fffffffffffffd70,
                        (size_type)in_stack_fffffffffffffd68);
  local_38 = vector<duckdb::BaseStatistics,_true>::operator[]
                       ((vector<duckdb::BaseStatistics,_true> *)in_stack_fffffffffffffd70,
                        (size_type)in_stack_fffffffffffffd68);
  LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
  Value::Value((Value *)in_stack_fffffffffffffd80,
               (LogicalType *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  LogicalType::~LogicalType((LogicalType *)0x125a41e);
  LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
  Value::Value((Value *)in_stack_fffffffffffffd80,
               (LogicalType *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  LogicalType::~LogicalType((LogicalType *)0x125a456);
  local_140[0].stats_union._31_1_ = 1;
  bVar1 = NumericStats::HasMinMax(in_stack_fffffffffffffd70);
  if ((bVar1) && (bVar1 = NumericStats::HasMinMax(in_stack_fffffffffffffd70), bVar1)) {
    PVar2 = LogicalType::InternalType((LogicalType *)(local_28 + 0x38));
    in_stack_fffffffffffffd90 =
         (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
         (ulong)(byte)(PVar2 - INT8);
    switch(in_stack_fffffffffffffd90) {
    case (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)0x0:
      in_stack_fffffffffffffd8f =
           AddPropagateStatistics::Operation<signed_char,duckdb::TryDecimalAdd>
                     ((LogicalType *)in_stack_fffffffffffffe18,
                      (BaseStatistics *)in_stack_fffffffffffffe10,
                      (BaseStatistics *)in_stack_fffffffffffffe08,(Value *)in_stack_fffffffffffffe00
                      ,(Value *)in_stack_fffffffffffffdf8);
      local_140[0].stats_union._31_1_ = in_stack_fffffffffffffd8f;
      break;
    default:
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      local_140[0].stats_union._24_4_ = 1;
      goto LAB_0125a945;
    case (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)0x2:
      in_stack_fffffffffffffd8e =
           AddPropagateStatistics::Operation<short,duckdb::TryDecimalAdd>
                     ((LogicalType *)in_stack_fffffffffffffe18,
                      (BaseStatistics *)in_stack_fffffffffffffe10,
                      (BaseStatistics *)in_stack_fffffffffffffe08,(Value *)in_stack_fffffffffffffe00
                      ,(Value *)in_stack_fffffffffffffdf8);
      local_140[0].stats_union._31_1_ = in_stack_fffffffffffffd8e;
      break;
    case (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)0x4:
      in_stack_fffffffffffffd8d =
           AddPropagateStatistics::Operation<int,duckdb::TryDecimalAdd>
                     ((LogicalType *)in_stack_fffffffffffffe18,
                      (BaseStatistics *)in_stack_fffffffffffffe10,
                      (BaseStatistics *)in_stack_fffffffffffffe08,(Value *)in_stack_fffffffffffffe00
                      ,(Value *)in_stack_fffffffffffffdf8);
      local_140[0].stats_union._31_1_ = in_stack_fffffffffffffd8d;
      break;
    case (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)0x6:
      in_stack_fffffffffffffd8c =
           AddPropagateStatistics::Operation<long,duckdb::TryDecimalAdd>
                     (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20._M_head_impl,
                      (BaseStatistics *)in_stack_fffffffffffffe18,(Value *)in_stack_fffffffffffffe10
                      ,(Value *)in_stack_fffffffffffffe08);
      local_140[0].stats_union._31_1_ = in_stack_fffffffffffffd8c;
    }
  }
  if ((local_140[0].stats_union._31_1_ & 1) == 0) {
    in_stack_fffffffffffffd7f = optional_ptr::operator_cast_to_bool((optional_ptr *)(local_18 + 1));
    if ((bool)in_stack_fffffffffffffd7f) {
      in_stack_fffffffffffffd70 =
           (BaseStatistics *)
           optional_ptr<duckdb::FunctionData,_true>::operator->
                     ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_fffffffffffffd70);
      in_stack_fffffffffffffd68 =
           (Value *)FunctionData::Cast<duckdb::DecimalArithmeticBindData>
                              ((FunctionData *)in_stack_fffffffffffffd70);
      *(bool *)&(in_stack_fffffffffffffd68->type_).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = false
      ;
    }
    LogicalType::InternalType((LogicalType *)(local_28 + 0x38));
    GetScalarIntegerFunction<duckdb::AddOperator>(in_stack_fffffffffffffe3f);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(in_stack_fffffffffffffd90,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              CONCAT17(in_stack_fffffffffffffd8f,
                       CONCAT16(in_stack_fffffffffffffd8e,
                                CONCAT15(in_stack_fffffffffffffd8d,
                                         CONCAT14(in_stack_fffffffffffffd8c,
                                                  in_stack_fffffffffffffd88)))));
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0x125a866);
  }
  else {
    LogicalType::LogicalType(&in_stack_fffffffffffffd70->type,&in_stack_fffffffffffffd68->type_);
    Value::Value((Value *)in_stack_fffffffffffffd80,
                 (LogicalType *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    in_stack_fffffffffffffd80 = local_140;
    Value::operator=((Value *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    Value::~Value((Value *)in_stack_fffffffffffffd70);
    LogicalType::~LogicalType((LogicalType *)0x125a703);
    LogicalType::LogicalType(&in_stack_fffffffffffffd70->type,&in_stack_fffffffffffffd68->type_);
    Value::Value((Value *)in_stack_fffffffffffffd80,
                 (LogicalType *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    Value::operator=((Value *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    Value::~Value((Value *)in_stack_fffffffffffffd70);
    LogicalType::~LogicalType((LogicalType *)0x125a764);
  }
  LogicalType::LogicalType(&in_stack_fffffffffffffd70->type,&in_stack_fffffffffffffd68->type_);
  NumericStats::CreateEmpty
            ((LogicalType *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  LogicalType::~LogicalType((LogicalType *)0x125a899);
  NumericStats::SetMin
            (in_stack_fffffffffffffd80,
             (Value *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  NumericStats::SetMax
            (in_stack_fffffffffffffd80,
             (Value *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  BaseStatistics::CombineValidity((BaseStatistics *)&stack0xfffffffffffffdd0,local_30,local_38);
  BaseStatistics::ToUnique(in_stack_fffffffffffffdb8);
  local_140[0].stats_union._24_4_ = 1;
  BaseStatistics::~BaseStatistics(in_stack_fffffffffffffd70);
LAB_0125a945:
  Value::~Value((Value *)in_stack_fffffffffffffd70);
  Value::~Value((Value *)in_stack_fffffffffffffd70);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateNumericStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	D_ASSERT(child_stats.size() == 2);
	// can only propagate stats if the children have stats
	auto &lstats = child_stats[0];
	auto &rstats = child_stats[1];
	Value new_min, new_max;
	bool potential_overflow = true;
	if (NumericStats::HasMinMax(lstats) && NumericStats::HasMinMax(rstats)) {
		switch (expr.return_type.InternalType()) {
		case PhysicalType::INT8:
			potential_overflow =
			    PROPAGATE::template Operation<int8_t, OP>(expr.return_type, lstats, rstats, new_min, new_max);
			break;
		case PhysicalType::INT16:
			potential_overflow =
			    PROPAGATE::template Operation<int16_t, OP>(expr.return_type, lstats, rstats, new_min, new_max);
			break;
		case PhysicalType::INT32:
			potential_overflow =
			    PROPAGATE::template Operation<int32_t, OP>(expr.return_type, lstats, rstats, new_min, new_max);
			break;
		case PhysicalType::INT64:
			potential_overflow =
			    PROPAGATE::template Operation<int64_t, OP>(expr.return_type, lstats, rstats, new_min, new_max);
			break;
		default:
			return nullptr;
		}
	}
	if (potential_overflow) {
		new_min = Value(expr.return_type);
		new_max = Value(expr.return_type);
	} else {
		// no potential overflow: replace with non-overflowing operator
		if (input.bind_data) {
			auto &bind_data = input.bind_data->Cast<DecimalArithmeticBindData>();
			bind_data.check_overflow = false;
		}
		expr.function.function = GetScalarIntegerFunction<BASEOP>(expr.return_type.InternalType());
	}
	auto result = NumericStats::CreateEmpty(expr.return_type);
	NumericStats::SetMin(result, new_min);
	NumericStats::SetMax(result, new_max);
	result.CombineValidity(lstats, rstats);
	return result.ToUnique();
}